

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# additional.cpp
# Opt level: O2

bool isPrimeMillerRabin(BN *n,size_t k)

{
  bool bVar1;
  size_t shift;
  ulong uVar2;
  ulong uVar3;
  BN n1;
  BN x;
  BN a;
  BN t;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_c0;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_a8;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_90;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_60;
  _Vector_base<unsigned_short,_std::allocator<unsigned_short>_> local_48;
  
  bVar1 = BN::isEven(n);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    BN::BN((BN *)&local_c0,n);
    BN::operator--((BN *)&local_c0);
    shift = BN::countzeroright((BN *)&local_c0);
    BN::operator>>((BN *)&local_78,(BN *)&local_c0,shift);
    for (uVar2 = 0; uVar2 != k; uVar2 = uVar2 + 1) {
      BN::BN((BN *)&local_90,uVar2 + 2);
      BN::PowMod((BN *)&local_a8,(BN *)&local_90,(BN *)&local_78,n);
      BN::bn1();
      bVar1 = BN::operator==((BN *)&local_a8,(BN *)&local_48);
      if (bVar1) {
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
      }
      else {
        bVar1 = BN::operator==((BN *)&local_a8,(BN *)&local_c0);
        std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_48)
        ;
        if (!bVar1) {
          bVar1 = false;
          for (uVar3 = 0; (bVar1 == false && (uVar3 < shift - 1)); uVar3 = uVar3 + 1) {
            BN::Qrt((BN *)&local_60,(BN *)&local_a8);
            BN::operator%((BN *)&local_48,(BN *)&local_60,n);
            BN::operator=((BN *)&local_a8,(BN *)&local_48);
            std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                      (&local_48);
            std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                      (&local_60);
            BN::bn1();
            bVar1 = BN::operator==((BN *)&local_a8,(BN *)&local_48);
            std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                      (&local_48);
            if (bVar1) goto LAB_0010834f;
            bVar1 = BN::operator==((BN *)&local_a8,(BN *)&local_c0);
          }
          if (bVar1 == false) {
LAB_0010834f:
            bVar1 = k <= uVar2;
            std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                      (&local_a8);
            std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base
                      (&local_90);
            goto LAB_00108374;
          }
        }
      }
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_a8);
      std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_90);
    }
    bVar1 = true;
LAB_00108374:
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_78);
    std::_Vector_base<unsigned_short,_std::allocator<unsigned_short>_>::~_Vector_base(&local_c0);
  }
  return bVar1;
}

Assistant:

bool isPrimeMillerRabin(const BN& n, size_t k) {
    if (n.isEven()) {
        return false;
    }
    BN n1(n);
    --n1;
    size_t s = n1.countzeroright();
    BN t = n1 >> s;
    for (size_t i = 0; i < k; ++i) {
        BN a(uint64_t(i + 2));
        BN x = a.PowMod(t, n);
        if (x == BN::bn1() || x == n1)
            continue;
        bool stop = false;
        for (size_t j = 0; !stop && j < s - 1; ++j) {
            x = x.Qrt() % n;
            if (x == BN::bn1())
                return false;
            if (x == n1)
                stop = true;
        }
        if (!stop)
            return false;
    }
    return true;
}